

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masterserver.cpp
# Opt level: O2

int __thiscall CMasterServer::Load(CMasterServer *this)

{
  int *piVar1;
  long lVar2;
  IStorage *pIVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  char *pcVar6;
  char *pcVar7;
  CMasterInfo *a;
  char *__dest;
  long lVar8;
  long in_FS_OFFSET;
  char aAddrStr [48];
  CMasterInfo Info;
  CLineReader LineReader;
  IOHANDLE IoHandle;
  
  LineReader.m_aBuffer[0x20] = '\0';
  LineReader.m_aBuffer[0x21] = '\0';
  LineReader.m_aBuffer[0x22] = '\0';
  LineReader.m_aBuffer[0x23] = '\0';
  LineReader.m_aBuffer[0x24] = '\0';
  LineReader.m_aBuffer[0x25] = '\0';
  LineReader.m_aBuffer[0x26] = '\0';
  LineReader.m_aBuffer[0x27] = '\0';
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar3 = this->m_pStorage;
  iVar5 = -1;
  if (pIVar3 != (IStorage *)0x0) {
    iVar4 = (*(pIVar3->super_IInterface)._vptr_IInterface[4])(pIVar3,"masters.cfg",9,0,0,0,0,0);
    IoHandle = (IOHANDLE)CONCAT44(extraout_var,iVar4);
    if (IoHandle != (IOHANDLE)0x0) {
      CLineReader::Init(&LineReader,IoHandle);
      pcVar7 = this[-1].m_aMasterServers[3].m_aHostname + 0x28;
LAB_001b5295:
      while( true ) {
        memset(&Info,0,0x168);
        Info.m_Lookup.m_Job.m_Status = 2;
        Info.m_Lookup.m_Job.m_pFuncData = (void *)0x0;
        pcVar6 = CLineReader::Get(&LineReader);
        if (pcVar6 == (char *)0x0) break;
        iVar5 = __isoc99_sscanf(pcVar6,"%127s %47s",&Info,aAddrStr);
        if (iVar5 == 2) {
          iVar5 = net_addr_from_str(&Info.m_Addr,aAddrStr);
          if (iVar5 == 0) {
            Info.m_Addr.port = 0x205b;
            lVar8 = 0;
            a = this->m_aMasterServers;
            do {
              lVar8 = lVar8 + -0x168;
              if (lVar8 == -0x708) {
                lVar8 = 5;
                pcVar6 = pcVar7;
                goto LAB_001b535f;
              }
              iVar5 = str_comp(a->m_aHostname,Info.m_aHostname);
              a = a + 1;
            } while (iVar5 != 0);
            __dest = pcVar7 + -lVar8;
            goto LAB_001b5377;
          }
        }
      }
LAB_001b5389:
      io_close(IoHandle);
      iVar5 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar5;
  }
  __stack_chk_fail();
  while (__dest = pcVar6 + 0x168, piVar1 = (int *)(pcVar6 + 0x1e8), pcVar6 = __dest, *piVar1 != 0) {
LAB_001b535f:
    lVar8 = lVar8 + -1;
    if (lVar8 == 0) goto LAB_001b5389;
  }
LAB_001b5377:
  memcpy(__dest,&Info,0x168);
  goto LAB_001b5295;
}

Assistant:

virtual int Load()
	{
		if(!m_pStorage)
			return -1;

		// try to open file
		IOHANDLE File = m_pStorage->OpenFile("masters.cfg", IOFLAG_READ | IOFLAG_SKIP_BOM, IStorage::TYPE_SAVE);
		if(!File)
			return -1;

		CLineReader LineReader;
		LineReader.Init(File);
		while(1)
		{
			CMasterInfo Info = {{0}};
			const char *pLine = LineReader.Get();
			if(!pLine)
				break;

			// parse line
			char aAddrStr[NETADDR_MAXSTRSIZE];
			if(sscanf(pLine, "%127s %47s", Info.m_aHostname, aAddrStr) == 2 && net_addr_from_str(&Info.m_Addr, aAddrStr) == 0)
			{
				Info.m_Addr.port = MASTERSERVER_PORT;
				bool Added = false;
				for(int i = 0; i < MAX_MASTERSERVERS; ++i)
					if(str_comp(m_aMasterServers[i].m_aHostname, Info.m_aHostname) == 0)
					{
						m_aMasterServers[i] = Info;
						Added = true;
						break;
					}

				if(!Added)
				{
					for(int i = 0; i < MAX_MASTERSERVERS; ++i)
						if(m_aMasterServers[i].m_Addr.type == NETTYPE_INVALID)
						{
							m_aMasterServers[i] = Info;
							Added = true;
							break;
						}
				}

				if(!Added)
					break;
			}
		}

		io_close(File);
		return 0;
	}